

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AngleR.cpp
# Opt level: O0

void __thiscall OpenMD::AngleR::writeAngleR(AngleR *this)

{
  byte bVar1;
  char *pcVar2;
  ostream *poVar3;
  string *psVar4;
  ulong uVar5;
  size_type sVar6;
  reference pvVar7;
  undefined8 uVar8;
  StaticAnalyser *in_RDI;
  RealType r;
  uint i;
  Revision rev;
  ofstream ofs;
  Revision *in_stack_fffffffffffffcf8;
  Revision *in_stack_fffffffffffffd48;
  uint local_25c;
  string local_258 [32];
  string local_238 [48];
  ostream local_208 [520];
  
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(local_208,pcVar2,_S_out);
  bVar1 = std::ofstream::is_open();
  if ((bVar1 & 1) == 0) {
    uVar8 = std::__cxx11::string::c_str();
    snprintf(painCave.errMsg,2000,"AngleR: unable to open %s\n",uVar8);
    painCave.isFatal = 1;
    simError();
  }
  else {
    poVar3 = std::operator<<(local_208,"# ");
    psVar4 = StaticAnalyser::getAnalysisType_abi_cxx11_(in_RDI);
    poVar3 = std::operator<<(poVar3,(string *)psVar4);
    std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(local_208,"# OpenMD ");
    Revision::getFullRevision_abi_cxx11_(in_stack_fffffffffffffd48);
    poVar3 = std::operator<<(poVar3,local_238);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string(local_238);
    poVar3 = std::operator<<(local_208,"# ");
    Revision::getBuildDate_abi_cxx11_(in_stack_fffffffffffffcf8);
    poVar3 = std::operator<<(poVar3,local_258);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string(local_258);
    poVar3 = std::operator<<(local_208,"#nFrames:\t");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*(int *)&in_RDI[0x11].info_);
    std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(local_208,"#selection1: (");
    poVar3 = std::operator<<(poVar3,(string *)&in_RDI[1].dumpFilename_);
    std::operator<<(poVar3,")");
    if (((ulong)in_RDI[1].info_ & 1) == 0) {
      poVar3 = std::operator<<(local_208,"\tselection2: (");
      poVar3 = std::operator<<(poVar3,(string *)&in_RDI[1].step_);
      std::operator<<(poVar3,")");
    }
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      poVar3 = std::operator<<(local_208,"# parameters: ");
      poVar3 = std::operator<<(poVar3,(string *)&in_RDI->paramString_);
      std::operator<<(poVar3,"\n");
    }
    std::operator<<(local_208,"#r\tcorrValue\n");
    for (local_25c = 0;
        sVar6 = std::vector<double,_std::allocator<double>_>::size
                          ((vector<double,_std::allocator<double>_> *)
                           &in_RDI[0x11].outputFilename_._M_string_length), local_25c < sVar6;
        local_25c = local_25c + 1) {
      poVar3 = (ostream *)
               std::ostream::operator<<
                         (local_208,
                          *(double *)&in_RDI[0x11].dumpFilename_.field_2 * ((double)local_25c + 0.5)
                         );
      poVar3 = std::operator<<(poVar3,"\t");
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)
                          &in_RDI[0x11].outputFilename_._M_string_length,(ulong)local_25c);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pvVar7);
      std::operator<<(poVar3,"\n");
    }
  }
  std::ofstream::close();
  std::ofstream::~ofstream(local_208);
  return;
}

Assistant:

void AngleR::writeAngleR() {
    std::ofstream ofs(outputFilename_.c_str());
    if (ofs.is_open()) {
      Revision rev;

      ofs << "# " << getAnalysisType() << "\n";
      ofs << "# OpenMD " << rev.getFullRevision() << "\n";
      ofs << "# " << rev.getBuildDate() << "\n";
      ofs << "#nFrames:\t" << nProcessed_ << "\n";
      ofs << "#selection1: (" << selectionScript1_ << ")";
      if (!doVect_) { ofs << "\tselection2: (" << selectionScript2_ << ")"; }
      if (!paramString_.empty())
        ofs << "# parameters: " << paramString_ << "\n";

      ofs << "#r\tcorrValue\n";
      for (unsigned int i = 0; i < avgAngleR_.size(); ++i) {
        RealType r = deltaR_ * (i + 0.5);
        ofs << r << "\t" << avgAngleR_[i] << "\n";
      }

    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "AngleR: unable to open %s\n", outputFilename_.c_str());
      painCave.isFatal = 1;
      simError();
    }

    ofs.close();
  }